

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void __thiscall
fill<64U,_33U,_buffer_layout_dfs>::operator()
          (fill<64U,_33U,_buffer_layout_dfs> *this,array<Stream,_64UL> *streams,uchar **buffer,
          array<unsigned_long,_64UL> *buffer_count)

{
  ulong uVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uchar **ppuVar8;
  uchar **ppuVar9;
  ulong uVar10;
  ulong uVar11;
  uchar **local_80;
  uchar **local_78;
  size_t local_70;
  DI local_38;
  
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"fill_leaf");
  poVar3 = std::operator<<(poVar3,", leaf,  I=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  local_38.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  if (buffer_count->_M_elems[0x21] != 0) {
    __assert_fail("buffer_count[I] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/funnelsort.cpp"
                  ,0x13b,
                  "void fill_leaf(std::array<Stream, K> &__restrict, unsigned char **__restrict, std::array<size_t, K> &__restrict, std::true_type) [K = 64U, I = 33U, BufferLayout = buffer_layout_dfs]"
                 );
  }
  local_70 = streams->_M_elems[2].n;
  uVar10 = streams->_M_elems[3].n;
  uVar1 = uVar10 + local_70;
  if (uVar1 < 0x17) {
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"need=");
    local_80 = (uchar **)0x17;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", Ln=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", Rn=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\n");
    if (local_70 != 0) {
      if (uVar10 == 0) {
        local_78 = (uchar **)0x17;
LAB_0019dd13:
        poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        poVar3 = std::operator<<(poVar3,"right drained, Ln=");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,", Rn=");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3,"\n");
        memcpy(buffer + -uVar1 + 0x255 + (0x17 - (long)local_78),streams->_M_elems[2].stream,
               local_70 << 3);
        streams->_M_elems[2].n = 0;
        buffer_count->_M_elems[0x21] = uVar1;
        check_input(buffer + -uVar1 + 0x255,uVar1);
        goto LAB_0019de8f;
      }
      local_80 = streams->_M_elems[2].stream;
      lVar7 = 0x17;
      ppuVar8 = streams->_M_elems[3].stream;
      do {
        uVar5 = uVar10;
        lVar4 = lVar7;
        lVar7 = -1;
        uVar6 = 0;
        ppuVar9 = ppuVar8;
        while (iVar2 = cmp(*local_80,ppuVar8[uVar6]), 0 < iVar2) {
          buffer[((uVar6 + 0x26c) - lVar4) - uVar1] = ppuVar8[uVar6];
          ppuVar9 = ppuVar9 + 1;
          streams->_M_elems[3].stream = ppuVar9;
          streams->_M_elems[3].n = uVar5 + lVar7;
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + -1;
          if (uVar5 == uVar6) {
            local_78 = (uchar **)(lVar4 - uVar6);
            goto LAB_0019dd13;
          }
        }
        buffer[((uVar6 + 0x26c) - lVar4) - uVar1] = *local_80;
        local_80 = local_80 + 1;
        streams->_M_elems[2].stream = local_80;
        local_70 = local_70 - 1;
        streams->_M_elems[2].n = local_70;
        lVar7 = ~uVar6 + lVar4;
        uVar10 = uVar5 - uVar6;
        ppuVar8 = ppuVar9;
      } while (local_70 != 0);
      uVar10 = uVar5 - uVar6;
      local_80 = (uchar **)(~uVar6 + lVar4);
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"left drained, Ln=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", Rn=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\n");
    if (uVar10 != 0) {
      memcpy(buffer + -uVar1 + (0x26c - (long)local_80),streams->_M_elems[3].stream,uVar10 << 3);
    }
    streams->_M_elems[3].n = 0;
    buffer_count->_M_elems[0x21] = uVar1;
    goto LAB_0019de8f;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"need=");
  lVar7 = 0x17;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", Ln=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", Rn=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  if (local_70 == 0) {
LAB_0019dc55:
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"left drained, Ln=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", Rn=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\n");
    ppuVar8 = streams->_M_elems[3].stream;
    if (lVar7 != 0) {
      memcpy(buffer + (0x255 - lVar7),ppuVar8,lVar7 * 8);
    }
    streams->_M_elems[3].n = uVar10 - lVar7;
    streams->_M_elems[3].stream = ppuVar8 + lVar7;
  }
  else {
    if (uVar10 != 0) {
      local_78 = streams->_M_elems[2].stream;
      uVar1 = 0x17;
      ppuVar8 = streams->_M_elems[3].stream;
      do {
        uVar6 = uVar10;
        uVar5 = uVar1;
        uVar11 = 0;
        lVar7 = -1;
        ppuVar9 = ppuVar8;
        while( true ) {
          if (uVar5 == uVar11) goto LAB_0019de7c;
          iVar2 = cmp(*local_78,ppuVar8[uVar11]);
          if (iVar2 < 1) break;
          buffer[(uVar11 + 0x255) - uVar5] = ppuVar8[uVar11];
          ppuVar9 = ppuVar9 + 1;
          streams->_M_elems[3].stream = ppuVar9;
          streams->_M_elems[3].n = lVar7 + uVar6;
          uVar11 = uVar11 + 1;
          lVar7 = lVar7 + -1;
          if (uVar6 == uVar11) {
            lVar7 = uVar5 - uVar11;
            goto LAB_0019ddeb;
          }
        }
        buffer[(uVar11 + 0x255) - uVar5] = *local_78;
        local_78 = local_78 + 1;
        streams->_M_elems[2].stream = local_78;
        local_70 = local_70 - 1;
        streams->_M_elems[2].n = local_70;
        uVar1 = ~uVar11 + uVar5;
        uVar10 = uVar6 - uVar11;
        ppuVar8 = ppuVar9;
      } while (local_70 != 0);
      uVar10 = uVar6 - uVar11;
      lVar7 = ~uVar11 + uVar5;
      goto LAB_0019dc55;
    }
    lVar7 = 0x17;
LAB_0019ddeb:
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"right drained, Ln=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", Rn=");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\n");
    ppuVar8 = streams->_M_elems[2].stream;
    if (lVar7 != 0) {
      memcpy(buffer + (0x255 - lVar7),ppuVar8,lVar7 * 8);
    }
    streams->_M_elems[2].n = local_70 - lVar7;
    streams->_M_elems[2].stream = ppuVar8 + lVar7;
  }
LAB_0019de7c:
  buffer_count->_M_elems[0x21] = 0x17;
  check_input(buffer + 0x23e,0x17);
LAB_0019de8f:
  anon_func::DI::~DI(&local_38);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}